

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test::TestBody
          (PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_240;
  Message local_238;
  ErrorCode local_22c;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  Error local_1e0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_1;
  uint64_t eui64;
  Message local_198;
  ErrorCode local_18c;
  Error local_188;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::CommissionerApp> commApp;
  uchar local_130 [16];
  iterator local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  Config config;
  PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test *this_local;
  
  config.mThreadSMRoot.field_2._8_8_ = this;
  Config::Config((Config *)local_110);
  local_110[0] = false;
  local_130[0] = '\0';
  local_130[1] = 0x11;
  local_130[2] = 0x22;
  local_130[3] = 0x33;
  local_130[4] = 0x44;
  local_130[5] = 0x55;
  local_130[6] = 0x66;
  local_130[7] = 0x77;
  local_130[8] = 0x88;
  local_130[9] = 0x99;
  local_130[10] = 0xaa;
  local_130[0xb] = 0xbb;
  local_130[0xc] = 0xcc;
  local_130[0xd] = 0xdd;
  local_130[0xe] = 0xee;
  local_130[0xf] = 0xff;
  local_120 = local_130;
  local_118 = 0x10;
  __l._M_len = 0x10;
  __l._M_array = local_120;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&config.mId.field_2 + 8),__l);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)&gtest_ar.message_);
  CommissionerAppCreate
            (&local_188,(shared_ptr<ot::commissioner::CommissionerApp> *)&gtest_ar.message_,
             (Config *)local_110);
  local_18c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_160,"CommissionerAppCreate(commApp, config)","ErrorCode::kNone",
             &local_188,&local_18c);
  Error::~Error(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&eui64,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app_test.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&eui64,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&eui64);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x11223344556677;
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"PSKD01",&local_201);
  std::__cxx11::string::string(local_228);
  (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x15])
            (&local_1e0,peVar3,0,0x11223344556677,local_200,local_228);
  local_22c = kInvalidArgs;
  testing::internal::CmpHelperNE<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)local_1b8,"commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, \"PSKD01\")",
             "ErrorCode::kInvalidArgs",&local_1e0,&local_22c);
  Error::~Error(&local_1e0);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app_test.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)&gtest_ar.message_);
  Config::~Config((Config *)local_110);
  return;
}

Assistant:

TEST(PskdTest, Pskdvalidation_GoodPskdShouldBeAccepted)
{
    Config config;
    config.mEnableCcm = false;
    config.mPSKc = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    std::shared_ptr<CommissionerApp> commApp;
    EXPECT_EQ(CommissionerAppCreate(commApp, config), ErrorCode::kNone);

    constexpr uint64_t eui64 = 0x0011223344556677;

    EXPECT_NE(commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, "PSKD01"), ErrorCode::kInvalidArgs);
}